

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
agge::tests::RendererTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"88",&local_89);
  std::operator+(local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"RendererTests",&local_b1);
  std::operator+(in_RDI,local_30);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

test( RenderingSingleCellsPreservesRenditionPositions )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 7, 10 * 512, 0 }, }, cells2[] = { { 1300011, 11 * 512, 0 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = { { 0x7fffffff, 7, 0, -10 * 512 }, };

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());

				// ASSERT
				span reference2[] = { { 0x7fffffff, 1300011, 0, -11 * 512 }, };

				assert_equal(reference2, sl2.spans_log);
			}